

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall
QEvdevTabletHandlerThread::QEvdevTabletHandlerThread
          (QEvdevTabletHandlerThread *this,QString *device,QString *spec,QObject *parent)

{
  QDaemonThread::QDaemonThread(&this->super_QDaemonThread,parent);
  *(undefined ***)this = &PTR_metaObject_0010f670;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->m_device).d,&device->d);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->m_spec).d,&spec->d);
  this->m_handler = (QEvdevTabletHandler *)0x0;
  QThread::start(this,7);
  return;
}

Assistant:

QEvdevTabletHandlerThread::QEvdevTabletHandlerThread(const QString &device, const QString &spec, QObject *parent)
    : QDaemonThread(parent), m_device(device), m_spec(spec), m_handler(0)
{
    start();
}